

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::Own<kj::_::EagerPromiseNode<kj::_::Void>_>::dispose
          (Own<kj::_::EagerPromiseNode<kj::_::Void>_> *this)

{
  EagerPromiseNode<kj::_::Void> *object;
  EagerPromiseNode<kj::_::Void> *ptrCopy;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> *this_local;
  
  object = this->ptr;
  if (object != (EagerPromiseNode<kj::_::Void> *)0x0) {
    this->ptr = (EagerPromiseNode<kj::_::Void> *)0x0;
    Disposer::dispose<kj::_::EagerPromiseNode<kj::_::Void>>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }